

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_suite.cpp
# Opt level: O2

void from_suite::fail_on_struct(void)

{
  bool v;
  error_category *peVar1;
  undefined **error_00;
  any any;
  error_code error;
  variable result;
  
  any.content = (placeholder *)operator_new(0x10);
  error_00 = &PTR__placeholder_00139a28;
  (any.content)->_vptr_placeholder = (_func_int **)&PTR__placeholder_00139a28;
  error._M_value = 0;
  error._M_cat = (error_category *)std::_V2::system_category();
  trial::dynamic::convert::into<trial::dynamic::basic_variable<std::allocator<char>>,boost::any>
            (&result,(convert *)&any,(any *)&error,(error_code *)error_00);
  v = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::nullable>(&result);
  boost::detail::test_impl
            ("result.is<nullable>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/convert/boost/any_suite.cpp"
             ,0x134,"void from_suite::fail_on_struct()",v);
  peVar1 = trial::dynamic::error_category();
  boost::detail::test_impl
            ("error == make_error_code(incompatible_type)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/convert/boost/any_suite.cpp"
             ,0x135,"void from_suite::fail_on_struct()",
             error._M_value == 1 && error._M_cat == peVar1);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
  ::~small_union(&result.storage);
  if (any.content != (placeholder *)0x0) {
    (*(any.content)->_vptr_placeholder[1])();
  }
  return;
}

Assistant:

void fail_on_struct()
{
    struct record {};
    boost::any any(record{});
    std::error_code error;
    variable result = convert::into<variable>(any, error);
    TRIAL_PROTOCOL_TEST(result.is<nullable>());
    TRIAL_PROTOCOL_TEST(error == make_error_code(incompatible_type));
}